

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  ulong uVar17;
  ulong extraout_RAX;
  int iVar18;
  ulong uVar19;
  undefined4 uVar20;
  NodeRef *pNVar21;
  long lVar22;
  RayQueryContext *pRVar23;
  RayQueryContext *pRVar24;
  RayQueryContext *pRVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  bool bVar27;
  vfloat_impl<4> __tmp;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar39;
  float fVar40;
  vfloat_impl<4> __tmp_1;
  undefined1 auVar37 [16];
  float fVar41;
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar52;
  float fVar53;
  vint4 ai;
  float fVar54;
  undefined1 auVar47 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar60;
  vint4 ai_1;
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar57 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  vint4 ai_3;
  float fVar67;
  float fVar68;
  float fVar70;
  float fVar71;
  vint4 bi;
  undefined1 auVar69 [16];
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  vint4 bi_3;
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar81;
  float fVar82;
  float fVar83;
  vint4 bi_1;
  float fVar84;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  uint uVar86;
  uint uVar87;
  float fVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  vint4 ai_2;
  float fVar93;
  uint uVar94;
  uint uVar95;
  uint uVar96;
  uint uVar98;
  uint uVar99;
  vint4 bi_2;
  undefined1 auVar97 [16];
  uint uVar100;
  float fVar102;
  undefined1 auVar101 [16];
  float fVar103;
  float fVar105;
  undefined1 in_XMM12 [16];
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 in_XMM13 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 in_XMM14 [16];
  float fVar114;
  Precalculations pre;
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar17 = *(ulong *)((valid_i->field_0).v[0] + 0x70);
  if (uVar17 != 8) {
    auVar34._8_4_ = 0xffffffff;
    auVar34._0_8_ = 0xffffffffffffffff;
    auVar34._12_4_ = 0xffffffff;
    auVar80._0_4_ = -(uint)(*(int *)this == -1);
    auVar80._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar80._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar80._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar18 = movmskps((int)ray,auVar80);
    uVar19 = CONCAT44((int)((ulong)ray >> 0x20),iVar18);
    if (iVar18 != 0) {
      auVar33._0_8_ = (This->intersector4).intersect;
      auVar33._8_8_ = (This->intersector4).occluded;
      fVar81 = (float)((ulong)auVar33._0_8_ >> 0x20);
      fVar84 = (float)((ulong)auVar33._8_8_ >> 0x20);
      fVar55 = (float)DAT_01f4bd50;
      fVar58 = DAT_01f4bd50._4_4_;
      fVar60 = DAT_01f4bd50._8_4_;
      fVar62 = DAT_01f4bd50._12_4_;
      auVar69._4_4_ = -(uint)(ABS(fVar81) < fVar58);
      auVar69._0_4_ = -(uint)(ABS((float)auVar33._0_8_) < fVar55);
      auVar69._8_4_ = -(uint)(ABS((float)auVar33._8_8_) < fVar60);
      auVar69._12_4_ = -(uint)(ABS(fVar84) < fVar62);
      auVar69 = blendvps(auVar33,_DAT_01f4bd50,auVar69);
      auVar3 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar97._4_4_ = -(uint)(ABS(auVar3._4_4_) < fVar58);
      auVar97._0_4_ = -(uint)(ABS(auVar3._0_4_) < fVar55);
      auVar97._8_4_ = -(uint)(ABS(auVar3._8_4_) < fVar60);
      auVar97._12_4_ = -(uint)(ABS(auVar3._12_4_) < fVar62);
      auVar97 = blendvps(auVar3,_DAT_01f4bd50,auVar97);
      auVar4._0_8_ = (This->intersector4_filter).occluded;
      auVar4._8_8_ = (This->intersector4_filter).name;
      fVar88 = (float)((ulong)auVar4._0_8_ >> 0x20);
      fVar93 = (float)((ulong)auVar4._8_8_ >> 0x20);
      auVar101._4_4_ = -(uint)(ABS(fVar88) < fVar58);
      auVar101._0_4_ = -(uint)(ABS((float)auVar4._0_8_) < fVar55);
      auVar101._8_4_ = -(uint)(ABS((float)auVar4._8_8_) < fVar60);
      auVar101._12_4_ = -(uint)(ABS(fVar93) < fVar62);
      auVar101 = blendvps(auVar4,_DAT_01f4bd50,auVar101);
      auVar104 = rcpps(in_XMM12,auVar69);
      local_1728 = auVar104._0_4_;
      fStack_1724 = auVar104._4_4_;
      fStack_1720 = auVar104._8_4_;
      fStack_171c = auVar104._12_4_;
      auVar104 = rcpps(in_XMM13,auVar97);
      local_1738 = auVar104._0_4_;
      fStack_1734 = auVar104._4_4_;
      fStack_1730 = auVar104._8_4_;
      fStack_172c = auVar104._12_4_;
      auVar104 = rcpps(in_XMM14,auVar101);
      local_1748 = auVar104._0_4_;
      fStack_1744 = auVar104._4_4_;
      fStack_1740 = auVar104._8_4_;
      fStack_173c = auVar104._12_4_;
      auVar79._0_8_ =
           CONCAT44(-(uint)(fVar81 < 0.0),-(uint)((float)auVar33._0_8_ < 0.0)) & 0x100000001;
      auVar79._8_4_ = -(uint)((float)auVar33._8_8_ < 0.0) & 1;
      auVar79._12_4_ = -(uint)(fVar84 < 0.0) & 1;
      auVar74._0_8_ =
           CONCAT44(-(uint)(auVar3._4_4_ < 0.0),-(uint)(auVar3._0_4_ < 0.0)) & 0x200000002;
      auVar74._8_4_ = -(uint)(auVar3._8_4_ < 0.0) & 2;
      auVar74._12_4_ = -(uint)(auVar3._12_4_ < 0.0) & 2;
      fVar81 = *(float *)&This->ptr;
      fVar84 = *(float *)((long)&This->ptr + 4);
      fVar102 = *(float *)&This->leafIntersector;
      fVar103 = *(float *)((long)&This->leafIntersector + 4);
      fVar55 = *(float *)&(This->collider).collide;
      fVar58 = *(float *)((long)&(This->collider).collide + 4);
      fVar60 = *(float *)&(This->collider).name;
      fVar62 = *(float *)((long)&(This->collider).name + 4);
      local_16e8 = (This->intersector1).intersect;
      uStack_16e0 = (This->intersector1).occluded;
      auVar104._8_4_ = -(uint)((float)auVar4._8_8_ < 0.0) & 4;
      auVar104._0_8_ =
           CONCAT44(-(uint)(fVar88 < 0.0),-(uint)((float)auVar4._0_8_ < 0.0)) & 0x400000004;
      auVar104._12_4_ = -(uint)(fVar93 < 0.0) & 4;
      auVar3._0_8_ = (This->intersector1).pointQuery;
      auVar3._8_8_ = (This->intersector1).name;
      local_1758 = auVar80 ^ auVar34 | auVar104 | auVar74 | auVar79;
      do {
        lVar22 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
          }
        }
        iVar18 = *(int *)(local_1758 + lVar22 * 4);
        auVar28._0_4_ = -(uint)(iVar18 == local_1758._0_4_);
        auVar28._4_4_ = -(uint)(iVar18 == local_1758._4_4_);
        auVar28._8_4_ = -(uint)(iVar18 == local_1758._8_4_);
        auVar28._12_4_ = -(uint)(iVar18 == local_1758._12_4_);
        uVar20 = movmskps((int)lVar22,auVar28);
        uVar19 = uVar19 & ~CONCAT44((int)((ulong)lVar22 >> 0x20),uVar20);
      } while (uVar19 != 0);
      local_1758._8_4_ = 0xffffffff;
      local_1758._0_8_ = 0xffffffffffffffff;
      local_1758._12_4_ = 0xffffffff;
      auVar37._0_4_ = -(uint)(*(int *)this == -1);
      auVar37._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar37._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar37._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      auVar80 = maxps(auVar3,ZEXT816(0));
      local_16f8.v = (__m128)blendvps(_DAT_01f45a30,auVar80,auVar37);
      local_1728 = local_1728 + (1.0 - auVar69._0_4_ * local_1728) * local_1728;
      fStack_1724 = fStack_1724 + (1.0 - auVar69._4_4_ * fStack_1724) * fStack_1724;
      fStack_1720 = fStack_1720 + (1.0 - auVar69._8_4_ * fStack_1720) * fStack_1720;
      fStack_171c = fStack_171c + (1.0 - auVar69._12_4_ * fStack_171c) * fStack_171c;
      local_1738 = local_1738 + (1.0 - auVar97._0_4_ * local_1738) * local_1738;
      fStack_1734 = fStack_1734 + (1.0 - auVar97._4_4_ * fStack_1734) * fStack_1734;
      fStack_1730 = fStack_1730 + (1.0 - auVar97._8_4_ * fStack_1730) * fStack_1730;
      fStack_172c = fStack_172c + (1.0 - auVar97._12_4_ * fStack_172c) * fStack_172c;
      auVar80 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,ZEXT816(0));
      _local_1788 = blendvps(_DAT_01f45a40,auVar80,auVar37);
      local_1748 = local_1748 + (1.0 - auVar101._0_4_ * local_1748) * local_1748;
      fStack_1744 = fStack_1744 + (1.0 - auVar101._4_4_ * fStack_1744) * fStack_1744;
      fStack_1740 = fStack_1740 + (1.0 - auVar101._8_4_ * fStack_1740) * fStack_1740;
      fStack_173c = fStack_173c + (1.0 - auVar101._12_4_ * fStack_173c) * fStack_173c;
      pNVar21 = stack_node + 2;
      paVar26 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = uVar17;
      stack_near[1].field_0 = local_16f8;
      local_1708 = fVar81;
      fStack_1704 = fVar84;
      fStack_1700 = fVar102;
      fStack_16fc = fVar103;
      local_1718 = fVar55;
      fStack_1714 = fVar58;
      fStack_1710 = fVar60;
      fStack_170c = fVar62;
      fVar88 = local_1728;
      fVar93 = fStack_1724;
      fVar105 = fStack_1720;
      fVar106 = fStack_171c;
      fVar107 = local_1738;
      fVar108 = fStack_1734;
      fVar109 = fStack_1730;
      fVar110 = fStack_172c;
      fVar111 = local_1748;
      fVar112 = fStack_1744;
      fVar113 = fStack_1740;
      fVar114 = fStack_173c;
LAB_006dcb37:
      pRVar25 = (RayQueryContext *)pNVar21[-1].ptr;
      if (pRVar25 != (RayQueryContext *)0xfffffffffffffff8) {
        pNVar21 = pNVar21 + -1;
        paVar1 = paVar26 + -1;
        pfVar9 = (float *)((long)paVar26 + -0xc);
        pfVar10 = (float *)((long)paVar26 + -8);
        pfVar11 = (float *)((long)paVar26 + -4);
        paVar26 = paVar26 + -1;
        auVar29._4_4_ = -(uint)(*pfVar9 < (float)local_1788._4_4_);
        auVar29._0_4_ = -(uint)(paVar1->v[0] < (float)local_1788._0_4_);
        auVar29._8_4_ = -(uint)(*pfVar10 < fStack_1780);
        auVar29._12_4_ = -(uint)(*pfVar11 < fStack_177c);
        uVar16 = movmskps((int)uVar17,auVar29);
        uVar17 = (ulong)uVar16;
        fVar36 = paVar1->v[0];
        fVar39 = *pfVar9;
        fVar40 = *pfVar10;
        fVar41 = *pfVar11;
        if (uVar16 != 0) {
          while (uVar16 = (uint)pRVar25, ((ulong)pRVar25 & 8) == 0) {
            uVar19 = (ulong)pRVar25 & 0xfffffffffffffff0;
            fVar42 = INFINITY;
            fVar43 = INFINITY;
            fVar44 = INFINITY;
            fVar45 = INFINITY;
            uVar17 = 0;
            pRVar25 = (RayQueryContext *)0x8;
            for (lVar22 = -0x10;
                (lVar22 != 0 &&
                (pRVar24 = *(RayQueryContext **)(uVar19 + 0x20 + lVar22 * 2),
                pRVar24 != (RayQueryContext *)0x8)); lVar22 = lVar22 + 4) {
              fVar54 = *(float *)(uVar19 + 0x90 + lVar22);
              fVar56 = *(float *)(uVar19 + 0x30 + lVar22);
              fVar72 = *(float *)(uVar19 + 0x40 + lVar22);
              fVar63 = *(float *)(uVar19 + 0x50 + lVar22);
              fVar73 = *(float *)(uVar19 + 0x60 + lVar22);
              fVar12 = *(float *)&(This->intersector4_nofilter).intersect;
              fVar13 = *(float *)((long)&(This->intersector4_nofilter).intersect + 4);
              fVar14 = *(float *)&(This->intersector4_nofilter).occluded;
              fVar15 = *(float *)((long)&(This->intersector4_nofilter).occluded + 4);
              fVar64 = *(float *)(uVar19 + 0xb0 + lVar22);
              fVar67 = *(float *)(uVar19 + 0xd0 + lVar22);
              fVar68 = *(float *)(uVar19 + 0x70 + lVar22);
              fVar75 = *(float *)(uVar19 + 0xa0 + lVar22);
              fVar76 = *(float *)(uVar19 + 0xc0 + lVar22);
              fVar77 = *(float *)(uVar19 + 0xe0 + lVar22);
              fVar2 = *(float *)(uVar19 + 0x80 + lVar22);
              fVar46 = ((fVar54 * fVar12 + fVar56) - fVar81) * fVar88;
              fVar52 = ((fVar54 * fVar13 + fVar56) - fVar84) * fVar93;
              fVar53 = ((fVar54 * fVar14 + fVar56) - fVar102) * fVar105;
              fVar54 = ((fVar54 * fVar15 + fVar56) - fVar103) * fVar106;
              fVar56 = ((fVar64 * fVar12 + fVar63) - fVar55) * fVar107;
              fVar59 = ((fVar64 * fVar13 + fVar63) - fVar58) * fVar108;
              fVar61 = ((fVar64 * fVar14 + fVar63) - fVar60) * fVar109;
              fVar63 = ((fVar64 * fVar15 + fVar63) - fVar62) * fVar110;
              fVar64 = ((fVar67 * fVar12 + fVar68) - (float)local_16e8) * fVar111;
              fVar65 = ((fVar67 * fVar13 + fVar68) - local_16e8._4_4_) * fVar112;
              fVar66 = ((fVar67 * fVar14 + fVar68) - (float)uStack_16e0) * fVar113;
              fVar67 = ((fVar67 * fVar15 + fVar68) - uStack_16e0._4_4_) * fVar114;
              fVar68 = ((fVar75 * fVar12 + fVar72) - fVar81) * fVar88;
              fVar70 = ((fVar75 * fVar13 + fVar72) - fVar84) * fVar93;
              fVar71 = ((fVar75 * fVar14 + fVar72) - fVar102) * fVar105;
              fVar72 = ((fVar75 * fVar15 + fVar72) - fVar103) * fVar106;
              fVar78 = ((fVar76 * fVar12 + fVar73) - fVar55) * fVar107;
              fVar82 = ((fVar76 * fVar13 + fVar73) - fVar58) * fVar108;
              fVar83 = ((fVar76 * fVar14 + fVar73) - fVar60) * fVar109;
              fVar85 = ((fVar76 * fVar15 + fVar73) - fVar62) * fVar110;
              fVar73 = ((fVar77 * fVar12 + fVar2) - (float)local_16e8) * fVar111;
              fVar75 = ((fVar77 * fVar13 + fVar2) - local_16e8._4_4_) * fVar112;
              fVar76 = ((fVar77 * fVar14 + fVar2) - (float)uStack_16e0) * fVar113;
              fVar77 = ((fVar77 * fVar15 + fVar2) - uStack_16e0._4_4_) * fVar114;
              uVar86 = (uint)((int)fVar68 < (int)fVar46) * (int)fVar68 |
                       (uint)((int)fVar68 >= (int)fVar46) * (int)fVar46;
              uVar89 = (uint)((int)fVar70 < (int)fVar52) * (int)fVar70 |
                       (uint)((int)fVar70 >= (int)fVar52) * (int)fVar52;
              uVar91 = (uint)((int)fVar71 < (int)fVar53) * (int)fVar71 |
                       (uint)((int)fVar71 >= (int)fVar53) * (int)fVar53;
              uVar94 = (uint)((int)fVar72 < (int)fVar54) * (int)fVar72 |
                       (uint)((int)fVar72 >= (int)fVar54) * (int)fVar54;
              uVar96 = (uint)((int)fVar78 < (int)fVar56) * (int)fVar78 |
                       (uint)((int)fVar78 >= (int)fVar56) * (int)fVar56;
              uVar98 = (uint)((int)fVar82 < (int)fVar59) * (int)fVar82 |
                       (uint)((int)fVar82 >= (int)fVar59) * (int)fVar59;
              uVar99 = (uint)((int)fVar83 < (int)fVar61) * (int)fVar83 |
                       (uint)((int)fVar83 >= (int)fVar61) * (int)fVar61;
              uVar100 = (uint)((int)fVar85 < (int)fVar63) * (int)fVar85 |
                        (uint)((int)fVar85 >= (int)fVar63) * (int)fVar63;
              uVar96 = ((int)uVar96 < (int)uVar86) * uVar86 | ((int)uVar96 >= (int)uVar86) * uVar96;
              uVar98 = ((int)uVar98 < (int)uVar89) * uVar89 | ((int)uVar98 >= (int)uVar89) * uVar98;
              uVar99 = ((int)uVar99 < (int)uVar91) * uVar91 | ((int)uVar99 >= (int)uVar91) * uVar99;
              uVar100 = ((int)uVar100 < (int)uVar94) * uVar94 |
                        ((int)uVar100 >= (int)uVar94) * uVar100;
              uVar86 = (uint)((int)fVar73 < (int)fVar64) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar64) * (int)fVar64;
              uVar89 = (uint)((int)fVar75 < (int)fVar65) * (int)fVar75 |
                       (uint)((int)fVar75 >= (int)fVar65) * (int)fVar65;
              uVar91 = (uint)((int)fVar76 < (int)fVar66) * (int)fVar76 |
                       (uint)((int)fVar76 >= (int)fVar66) * (int)fVar66;
              uVar94 = (uint)((int)fVar77 < (int)fVar67) * (int)fVar77 |
                       (uint)((int)fVar77 >= (int)fVar67) * (int)fVar67;
              uVar87 = ((int)uVar86 < (int)uVar96) * uVar96 | ((int)uVar86 >= (int)uVar96) * uVar86;
              uVar90 = ((int)uVar89 < (int)uVar98) * uVar98 | ((int)uVar89 >= (int)uVar98) * uVar89;
              uVar92 = ((int)uVar91 < (int)uVar99) * uVar99 | ((int)uVar91 >= (int)uVar99) * uVar91;
              uVar95 = ((int)uVar94 < (int)uVar100) * uVar100 |
                       ((int)uVar94 >= (int)uVar100) * uVar94;
              uVar86 = (uint)((int)fVar68 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar68 >= (int)fVar46) * (int)fVar68;
              uVar89 = (uint)((int)fVar70 < (int)fVar52) * (int)fVar52 |
                       (uint)((int)fVar70 >= (int)fVar52) * (int)fVar70;
              uVar91 = (uint)((int)fVar71 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar71 >= (int)fVar53) * (int)fVar71;
              uVar94 = (uint)((int)fVar72 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar72 >= (int)fVar54) * (int)fVar72;
              uVar96 = (uint)((int)fVar78 < (int)fVar56) * (int)fVar56 |
                       (uint)((int)fVar78 >= (int)fVar56) * (int)fVar78;
              uVar98 = (uint)((int)fVar82 < (int)fVar59) * (int)fVar59 |
                       (uint)((int)fVar82 >= (int)fVar59) * (int)fVar82;
              uVar99 = (uint)((int)fVar83 < (int)fVar61) * (int)fVar61 |
                       (uint)((int)fVar83 >= (int)fVar61) * (int)fVar83;
              uVar100 = (uint)((int)fVar85 < (int)fVar63) * (int)fVar63 |
                        (uint)((int)fVar85 >= (int)fVar63) * (int)fVar85;
              uVar96 = ((int)uVar86 < (int)uVar96) * uVar86 | ((int)uVar86 >= (int)uVar96) * uVar96;
              uVar98 = ((int)uVar89 < (int)uVar98) * uVar89 | ((int)uVar89 >= (int)uVar98) * uVar98;
              uVar99 = ((int)uVar91 < (int)uVar99) * uVar91 | ((int)uVar91 >= (int)uVar99) * uVar99;
              uVar100 = ((int)uVar94 < (int)uVar100) * uVar94 |
                        ((int)uVar94 >= (int)uVar100) * uVar100;
              uVar86 = (uint)((int)fVar73 < (int)fVar64) * (int)fVar64 |
                       (uint)((int)fVar73 >= (int)fVar64) * (int)fVar73;
              uVar89 = (uint)((int)fVar75 < (int)fVar65) * (int)fVar65 |
                       (uint)((int)fVar75 >= (int)fVar65) * (int)fVar75;
              uVar91 = (uint)((int)fVar76 < (int)fVar66) * (int)fVar66 |
                       (uint)((int)fVar76 >= (int)fVar66) * (int)fVar76;
              uVar94 = (uint)((int)fVar77 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar77 >= (int)fVar67) * (int)fVar77;
              uVar86 = (uint)((int)local_1788._0_4_ < (int)uVar86) * local_1788._0_4_ |
                       ((int)local_1788._0_4_ >= (int)uVar86) * uVar86;
              uVar89 = (uint)((int)local_1788._4_4_ < (int)uVar89) * local_1788._4_4_ |
                       ((int)local_1788._4_4_ >= (int)uVar89) * uVar89;
              uVar91 = (uint)((int)fStack_1780 < (int)uVar91) * (int)fStack_1780 |
                       ((int)fStack_1780 >= (int)uVar91) * uVar91;
              uVar94 = (uint)((int)fStack_177c < (int)uVar94) * (int)fStack_177c |
                       ((int)fStack_177c >= (int)uVar94) * uVar94;
              bVar27 = (float)((uint)((int)uVar87 < (int)local_16f8._0_4_) * local_16f8._0_4_ |
                              ((int)uVar87 >= (int)local_16f8._0_4_) * uVar87) <=
                       (float)(((int)uVar96 < (int)uVar86) * uVar96 |
                              ((int)uVar96 >= (int)uVar86) * uVar86);
              bVar5 = (float)((uint)((int)uVar90 < (int)local_16f8._4_4_) * local_16f8._4_4_ |
                             ((int)uVar90 >= (int)local_16f8._4_4_) * uVar90) <=
                      (float)(((int)uVar98 < (int)uVar89) * uVar98 |
                             ((int)uVar98 >= (int)uVar89) * uVar89);
              bVar6 = (float)((uint)((int)uVar92 < (int)local_16f8._8_4_) * local_16f8._8_4_ |
                             ((int)uVar92 >= (int)local_16f8._8_4_) * uVar92) <=
                      (float)(((int)uVar99 < (int)uVar91) * uVar99 |
                             ((int)uVar99 >= (int)uVar91) * uVar91);
              bVar7 = (float)((uint)((int)uVar95 < (int)local_16f8._12_4_) * local_16f8._12_4_ |
                             ((int)uVar95 >= (int)local_16f8._12_4_) * uVar95) <=
                      (float)(((int)uVar100 < (int)uVar94) * uVar100 |
                             ((int)uVar100 >= (int)uVar94) * uVar94);
              auVar47._4_4_ = -(uint)bVar5;
              auVar47._0_4_ = -(uint)bVar27;
              auVar47._8_4_ = -(uint)bVar6;
              auVar47._12_4_ = -(uint)bVar7;
              if ((uVar16 & 7) == 6) {
                fVar54 = *(float *)(uVar19 + 0xf0 + lVar22);
                fVar56 = *(float *)(uVar19 + 0x100 + lVar22);
                auVar47._0_4_ = -(uint)((fVar12 < fVar56 && fVar54 <= fVar12) && bVar27);
                auVar47._4_4_ = -(uint)((fVar13 < fVar56 && fVar54 <= fVar13) && bVar5);
                auVar47._8_4_ = -(uint)((fVar14 < fVar56 && fVar54 <= fVar14) && bVar6);
                auVar47._12_4_ = -(uint)((fVar15 < fVar56 && fVar54 <= fVar15) && bVar7);
              }
              auVar30._0_4_ = (-(uint)(fVar36 < (float)local_1788._0_4_) & auVar47._0_4_) << 0x1f;
              auVar30._4_4_ = (-(uint)(fVar39 < (float)local_1788._4_4_) & auVar47._4_4_) << 0x1f;
              auVar30._8_4_ = (-(uint)(fVar40 < fStack_1780) & auVar47._8_4_) << 0x1f;
              auVar30._12_4_ = (-(uint)(fVar41 < fStack_177c) & auVar47._12_4_) << 0x1f;
              uVar86 = movmskps((int)context,auVar30);
              context = (RayQueryContext *)(ulong)uVar86;
              if (uVar86 != 0) {
                auVar8._4_4_ = uVar90;
                auVar8._0_4_ = uVar87;
                auVar8._8_4_ = uVar92;
                auVar8._12_4_ = uVar95;
                aVar48.v = (__m128)blendvps(_DAT_01f45a30,auVar8,auVar30);
                auVar31._4_4_ = -(uint)(aVar48.v[1] < fVar43);
                auVar31._0_4_ = -(uint)(aVar48.v[0] < fVar42);
                auVar31._8_4_ = -(uint)(aVar48.v[2] < fVar44);
                auVar31._12_4_ = -(uint)(aVar48.v[3] < fVar45);
                iVar18 = movmskps(uVar86,auVar31);
                if (iVar18 == 0) {
                  aVar49.v[1] = fVar43;
                  aVar49.v[0] = fVar42;
                  aVar49.v[2] = fVar44;
                  aVar49.v[3] = fVar45;
                  pRVar23 = pRVar25;
                  pRVar25 = pRVar24;
                  aVar32 = aVar48;
LAB_006dcd50:
                  uVar17 = uVar17 + 1;
                  pNVar21->ptr = (size_t)pRVar25;
                  pNVar21 = pNVar21 + 1;
                  *paVar26 = aVar32;
                  paVar26 = paVar26 + 1;
                  pRVar24 = pRVar23;
                  aVar48 = aVar49;
                }
                else {
                  aVar32.v[1] = fVar43;
                  aVar32.v[0] = fVar42;
                  aVar32.v[2] = fVar44;
                  aVar32.v[3] = fVar45;
                  pRVar23 = pRVar24;
                  aVar49 = aVar48;
                  if (pRVar25 != (RayQueryContext *)0x8) goto LAB_006dcd50;
                }
                fVar42 = aVar48.v[0];
                fVar43 = aVar48.v[1];
                fVar44 = aVar48.v[2];
                fVar45 = aVar48.v[3];
                context = pRVar25;
                pRVar25 = pRVar24;
              }
            }
            if (pRVar25 == (RayQueryContext *)0x8) goto LAB_006dcb37;
            fVar36 = fVar42;
            fVar39 = fVar43;
            fVar40 = fVar44;
            fVar41 = fVar45;
            if (1 < uVar17) {
              auVar80 = *(undefined1 (*) [16])paVar26[-2].v;
              auVar34 = *(undefined1 (*) [16])paVar26[-1].v;
              auVar50._4_4_ = -(uint)(auVar80._4_4_ < auVar34._4_4_);
              auVar50._0_4_ = -(uint)(auVar80._0_4_ < auVar34._0_4_);
              auVar50._8_4_ = -(uint)(auVar80._8_4_ < auVar34._8_4_);
              auVar50._12_4_ = -(uint)(auVar80._12_4_ < auVar34._12_4_);
              iVar18 = movmskps((int)uVar19,auVar50);
              auVar33 = auVar34;
              if (iVar18 != 0) {
                *(undefined1 (*) [16])paVar26[-2].v = auVar34;
                *(undefined1 (*) [16])paVar26[-1].v = auVar80;
                auVar33 = *(undefined1 (*) [16])(pNVar21 + -2);
                auVar51._0_8_ = auVar33._8_8_;
                auVar51._8_4_ = auVar33._0_4_;
                auVar51._12_4_ = auVar33._4_4_;
                *(undefined1 (*) [16])(pNVar21 + -2) = auVar51;
                auVar33 = auVar80;
                auVar80 = auVar34;
              }
              if (uVar17 != 2) {
                auVar34 = *(undefined1 (*) [16])paVar26[-3].v;
                auVar57._4_4_ = -(uint)(auVar34._4_4_ < auVar33._4_4_);
                auVar57._0_4_ = -(uint)(auVar34._0_4_ < auVar33._0_4_);
                auVar57._8_4_ = -(uint)(auVar34._8_4_ < auVar33._8_4_);
                auVar57._12_4_ = -(uint)(auVar34._12_4_ < auVar33._12_4_);
                uVar16 = movmskps((int)uVar17,auVar57);
                uVar17 = (ulong)uVar16;
                if (uVar16 != 0) {
                  *(undefined1 (*) [16])paVar26[-3].v = auVar33;
                  *(undefined1 (*) [16])paVar26[-1].v = auVar34;
                  uVar17 = pNVar21[-3].ptr;
                  pNVar21[-3].ptr = pNVar21[-1].ptr;
                  pNVar21[-1].ptr = uVar17;
                  auVar34 = auVar33;
                }
                auVar38._4_4_ = -(uint)(auVar34._4_4_ < auVar80._4_4_);
                auVar38._0_4_ = -(uint)(auVar34._0_4_ < auVar80._0_4_);
                auVar38._8_4_ = -(uint)(auVar34._8_4_ < auVar80._8_4_);
                auVar38._12_4_ = -(uint)(auVar34._12_4_ < auVar80._12_4_);
                uVar16 = movmskps((int)uVar17,auVar38);
                uVar17 = (ulong)uVar16;
                if (uVar16 != 0) {
                  *(undefined1 (*) [16])paVar26[-3].v = auVar80;
                  *(undefined1 (*) [16])paVar26[-2].v = auVar34;
                  auVar80 = *(undefined1 (*) [16])(pNVar21 + -3);
                  auVar35._0_8_ = auVar80._8_8_;
                  auVar35._8_4_ = auVar80._0_4_;
                  auVar35._12_4_ = auVar80._4_4_;
                  *(undefined1 (*) [16])(pNVar21 + -3) = auVar35;
                }
              }
            }
          }
          if (pRVar25 == (RayQueryContext *)&DAT_fffffffffffffff8) {
            return;
          }
          valid_leaf.field_0.i[1] = -(uint)(fVar39 < (float)local_1788._4_4_);
          valid_leaf.field_0.i[0] = -(uint)(fVar36 < (float)local_1788._0_4_);
          valid_leaf.field_0.i[2] = -(uint)(fVar40 < fStack_1780);
          valid_leaf.field_0.i[3] = -(uint)(fVar41 < fStack_177c);
          uVar86 = movmskps((int)uVar17,(undefined1  [16])valid_leaf.field_0);
          uVar17 = (ulong)uVar86;
          if (uVar86 != 0) {
            lVar22 = (ulong)(uVar16 & 0xf) - 8;
            pRVar25 = (RayQueryContext *)((ulong)pRVar25 & 0xfffffffffffffff0);
            while (bVar27 = lVar22 != 0, lVar22 = lVar22 + -1, bVar27) {
              context = pRVar25;
              InstanceArrayIntersectorKMB<4>::intersect
                        (&valid_leaf,&pre,(RayHitK<4> *)This,(RayQueryContext *)ray,
                         (Primitive_conflict4 *)pRVar25);
              pRVar25 = (RayQueryContext *)&pRVar25->user;
              uVar17 = extraout_RAX;
              fVar55 = local_1718;
              fVar58 = fStack_1714;
              fVar60 = fStack_1710;
              fVar62 = fStack_170c;
              fVar81 = local_1708;
              fVar84 = fStack_1704;
              fVar102 = fStack_1700;
              fVar103 = fStack_16fc;
            }
            _local_1788 = blendvps(_local_1788,
                                   *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                   (undefined1  [16])valid_leaf.field_0);
            fVar88 = local_1728;
            fVar93 = fStack_1724;
            fVar105 = fStack_1720;
            fVar106 = fStack_171c;
            fVar107 = local_1738;
            fVar108 = fStack_1734;
            fVar109 = fStack_1730;
            fVar110 = fStack_172c;
            fVar111 = local_1748;
            fVar112 = fStack_1744;
            fVar113 = fStack_1740;
            fVar114 = fStack_173c;
          }
        }
        goto LAB_006dcb37;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }